

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lejp-conf.c
# Opt level: O0

int lwsws_get_config_vhosts
              (lws_context *context,lws_context_creation_info *info,char *d,char **cs,int *len)

{
  int iVar1;
  char local_1b8 [8];
  char dd [128];
  jpargs a;
  lws_dir_args da;
  int *len_local;
  char **cs_local;
  char *d_local;
  lws_context_creation_info *info_local;
  lws_context *context_local;
  
  memset(dd + 0x78,0,0xe0);
  a.extensions = (lws_extension *)*cs;
  a.p = (char *)((long)&(a.extensions)->name + (long)*len);
  a.end._0_1_ = 0;
  a.context = (lws_context *)info->protocols;
  a.protocols = (lws_protocols *)info->pprotocols;
  a.pprotocols = (lws_protocols **)info->extensions;
  dd._120_8_ = info;
  a.info = (lws_context_creation_info *)context;
  lws_snprintf(local_1b8,0x7f,"%s/conf",d);
  iVar1 = lwsws_get_config(dd + 0x78,local_1b8,paths_vhosts,0x3f,lejp_vhosts_cb);
  if (iVar1 < 2) {
    lws_snprintf(local_1b8,0x7f,"%s/conf.d",d);
    a._216_8_ = dd + 0x78;
    iVar1 = lws_dir(local_1b8,&a.count_plugin_dirs,lwsws_get_config_d_cb);
    if (iVar1 < 2) {
      *cs = (char *)a.extensions;
      *len = (int)a.p - (int)a.extensions;
      if ((a.plugin_dirs._4_1_ >> 3 & 1) == 0) {
        _lws_log(1,"Need at least one vhost\n");
        context_local._4_4_ = 1;
      }
      else {
        context_local._4_4_ = 0;
      }
    }
    else {
      context_local._4_4_ = 1;
    }
  }
  else {
    context_local._4_4_ = 1;
  }
  return context_local._4_4_;
}

Assistant:

int
lwsws_get_config_vhosts(struct lws_context *context,
			struct lws_context_creation_info *info, const char *d,
			char **cs, int *len)
{
	struct lws_dir_args da;
	struct jpargs a;
	char dd[128];

	memset(&a, 0, sizeof(a));

	a.info = info;
	a.p = *cs;
	a.end = a.p + *len;
	a.valid = 0;
	a.context = context;
	a.protocols = info->protocols;
	a.pprotocols = info->pprotocols;
	a.extensions = info->extensions;

	lws_snprintf(dd, sizeof(dd) - 1, "%s/conf", d);
	if (lwsws_get_config(&a, dd, paths_vhosts,
			     LWS_ARRAY_SIZE(paths_vhosts), lejp_vhosts_cb) > 1)
		return 1;
	lws_snprintf(dd, sizeof(dd) - 1, "%s/conf.d", d);

	da.user = &a;
	da.paths = paths_vhosts;
	da.count_paths = LWS_ARRAY_SIZE(paths_vhosts),
	da.cb = lejp_vhosts_cb;

	if (lws_dir(dd, &da, lwsws_get_config_d_cb) > 1)
		return 1;

	*cs = a.p;
	*len = lws_ptr_diff(a.end, a.p);

	if (!a.any_vhosts) {
		lwsl_err("Need at least one vhost\n");
		return 1;
	}

//	lws_finalize_startup(context);

	return 0;
}